

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

string * __thiscall kratos::FSM::output_table_abi_cxx11_(string *__return_storage_ptr__,FSM *this)

{
  undefined1 *puVar1;
  mapped_type pVVar2;
  long lVar3;
  pointer ppVVar4;
  ulong uVar5;
  ostream *poVar6;
  mapped_type *ppVVar7;
  _Base_ptr p_Var8;
  Var **output;
  __node_base *p_Var9;
  undefined1 auVar10 [8];
  __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_> __i
  ;
  long lVar11;
  key_type *ppVVar12;
  stringstream local_210 [8];
  stringstream stream;
  undefined1 auStack_58 [8];
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> outputs;
  
  std::__cxx11::stringstream::stringstream(local_210);
  auStack_58 = (undefined1  [8])0x0;
  outputs.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::reserve
            ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)auStack_58,
             (this->outputs_)._M_h._M_element_count);
  p_Var9 = &(this->outputs_)._M_h._M_before_begin;
  while (ppVVar4 = outputs.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl
                   .super__Vector_impl_data._M_start, auVar10 = auStack_58, p_Var9 = p_Var9->_M_nxt,
        p_Var9 != (__node_base *)0x0) {
    std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Var*const&>
              ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)auStack_58,(Var **)(p_Var9 + 1))
    ;
  }
  if (auStack_58 !=
      (undefined1  [8])
      outputs.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar11 = (long)outputs.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl
                   .super__Vector_impl_data._M_start - (long)auStack_58;
    uVar5 = lVar11 >> 3;
    lVar3 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<kratos::Var**,std::vector<kratos::Var*,std::allocator<kratos::Var*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<kratos::FSM::output_table[abi:cxx11]()::__0>>
              (auStack_58,
               outputs.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
               super__Vector_impl_data._M_start,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar11 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<kratos::Var**,std::vector<kratos::Var*,std::allocator<kratos::Var*>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::FSM::output_table[abi:cxx11]()::__0>>
                (auVar10,ppVVar4);
    }
    else {
      ppVVar12 = (key_type *)((long)auVar10 + 0x80);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<kratos::Var**,std::vector<kratos::Var*,std::allocator<kratos::Var*>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::FSM::output_table[abi:cxx11]()::__0>>
                (auVar10,ppVVar12);
      for (; ppVVar12 != ppVVar4; ppVVar12 = ppVVar12 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<kratos::Var**,std::vector<kratos::Var*,std::allocator<kratos::Var*>>>,__gnu_cxx::__ops::_Val_comp_iter<kratos::FSM::output_table[abi:cxx11]()::__0>>
                  (ppVVar12);
      }
    }
  }
  std::operator<<((ostream *)&stream.field_0x8,"State");
  ppVVar4 = outputs.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar1 = &stream.field_0x180;
  for (auVar10 = auStack_58; auVar10 != (undefined1  [8])ppVVar4;
      auVar10 = (undefined1  [8])((long)auVar10 + 8)) {
    poVar6 = std::operator<<((ostream *)&stream.field_0x8,",");
    (*((*(key_type *)auVar10)->super_IRNode)._vptr_IRNode[0x1f])(puVar1);
    std::operator<<(poVar6,(string *)puVar1);
    std::__cxx11::string::~string((string *)puVar1);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&stream.field_0x8);
  puVar1 = &stream.field_0x180;
  for (p_Var8 = (this->states_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != &(this->states_)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    std::operator<<((ostream *)&stream.field_0x8,(string *)(p_Var8 + 1));
    ppVVar4 = outputs.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (auVar10 = auStack_58; auVar10 != (undefined1  [8])ppVVar4;
        auVar10 = (undefined1  [8])((long)auVar10 + 8)) {
      ppVVar7 = std::
                map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
                ::at((map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
                      *)(*(long *)(p_Var8 + 2) + 0x50),(key_type *)auVar10);
      pVVar2 = *ppVVar7;
      poVar6 = std::operator<<((ostream *)&stream.field_0x8,",");
      (*(pVVar2->super_IRNode)._vptr_IRNode[0x1f])(puVar1,pVVar2);
      std::operator<<(poVar6,(string *)puVar1);
      std::__cxx11::string::~string((string *)puVar1);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&stream.field_0x8);
  }
  std::__cxx11::stringbuf::str();
  std::_Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>::~_Vector_base
            ((_Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)auStack_58);
  std::__cxx11::stringstream::~stringstream(local_210);
  return __return_storage_ptr__;
}

Assistant:

std::string FSM::output_table() {
    std::stringstream stream;
    // sort the outputs
    std::vector<Var*> outputs;
    outputs.reserve(outputs_.size());
    for (auto const& iter : outputs_) outputs.emplace_back(iter.first);
    std::sort(outputs.begin(), outputs.end(),
              [](const auto& lhs, const auto& rhs) { return lhs->to_string() < rhs->to_string(); });
    // write the header
    stream << "State";
    for (const auto& var : outputs) stream << "," << var->to_string();
    stream << ::endl;

    // notice that we don't need to sort the state names since it's stored in map
    // which is ordered
    for (auto const& [state_name, state] : states_) {
        stream << state_name;
        for (auto const& output : outputs) {
            auto* value = state->output_values().at(output);
            stream << "," << value->to_string();
        }
        stream << ::endl;
    }

    return stream.str();
}